

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevent_fork.h
# Opt level: O0

void snmalloc::PreventFork::postfork_parent(void)

{
  long lVar1;
  undefined8 *in_FS_OFFSET;
  
  lVar1 = *(long *)*in_FS_OFFSET + -1;
  *(long *)*in_FS_OFFSET = lVar1;
  if (lVar1 == 0) {
    *(long *)*in_FS_OFFSET = *(long *)*in_FS_OFFSET + -1;
    std::__atomic_base<unsigned_long>::operator--
              (&threads_preventing_fork.super___atomic_base<unsigned_long>,0);
  }
  return;
}

Assistant:

static void postfork_parent()
    {
      // Count out the number of handlers that have been called, and
      // only perform on the last.
      if (--depth_of_handlers != 0)
        return;

      // This thread is no longer preventing a fork, so decrement the counter.
      depth_of_prevention--;

      // Allow other threads to allocate
      // Just remove the bit, and let the potential other threads in prefork
      // remove their counts.
      threads_preventing_fork--;
    }